

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void sig_int_handler(int sig)

{
  sigaction *local_18;
  sigaction *old;
  int sig_local;
  
  local_18 = (sigaction *)0x0;
  switch(sig) {
  case 2:
    local_18 = &fio_old_sig_int;
  case 0xf:
    if (local_18 == (sigaction *)0x0) {
      local_18 = &fio_old_sig_term;
    }
    fio_stop();
    break;
  case 10:
    fio_signal_children_flag = '\x01';
    local_18 = &fio_old_sig_usr1;
    break;
  case 0xd:
    local_18 = &fio_old_sig_pipe;
  default:
  }
  if (((local_18 != (sigaction *)0x0) &&
      ((local_18->__sigaction_handler).sa_handler != (__sighandler_t)0x1)) &&
     ((local_18->__sigaction_handler).sa_handler != (__sighandler_t)0x0)) {
    (*(local_18->__sigaction_handler).sa_handler)(sig);
  }
  return;
}

Assistant:

static void sig_int_handler(int sig) {
  struct sigaction *old = NULL;
  switch (sig) {
#if !FIO_DISABLE_HOT_RESTART
  case SIGUSR1:
    fio_signal_children_flag = 1;
    old = &fio_old_sig_usr1;
    break;
#endif
    /* fallthrough */
  case SIGINT:
    if (!old)
      old = &fio_old_sig_int;
    /* fallthrough */
  case SIGTERM:
    if (!old)
      old = &fio_old_sig_term;
    fio_stop();
    break;
  case SIGPIPE:
    if (!old)
      old = &fio_old_sig_pipe;
  /* fallthrough */
  default:
    break;
  }
  /* propagate signale handling to previous existing handler (if any) */
  if (old && old->sa_handler != SIG_IGN && old->sa_handler != SIG_DFL)
    old->sa_handler(sig);
}